

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O3

_Bool al_use_shader(ALLEGRO_SHADER *shader)

{
  ALLEGRO_SHADER *pAVar1;
  _Bool _Var2;
  uint uVar3;
  ALLEGRO_BITMAP *in_RAX;
  ALLEGRO_BITMAP *bitmap;
  ALLEGRO_DISPLAY *pAVar4;
  _Bool _Var5;
  char *msg;
  ALLEGRO_BITMAP *local_28;
  
  local_28 = in_RAX;
  bitmap = al_get_target_bitmap();
  if (bitmap == (ALLEGRO_BITMAP *)0x0) {
    _Var2 = _al_trace_prefix("shader",2,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/shader.c"
                             ,0x9c,"al_use_shader");
    if (!_Var2) {
      return false;
    }
    msg = "No current target bitmap.\n";
  }
  else {
    uVar3 = al_get_bitmap_flags(bitmap);
    if ((uVar3 & 1) == 0) {
      pAVar4 = _al_get_bitmap_display(bitmap);
      if (shader == (ALLEGRO_SHADER *)0x0) {
        pAVar1 = bitmap->shader;
        if (pAVar1 != (ALLEGRO_SHADER *)0x0) {
          (*pAVar1->vt->unuse_shader)(pAVar1,pAVar4);
          if (bitmap->shader != (ALLEGRO_SHADER *)0x0) {
            local_28 = bitmap;
            _al_vector_find_and_delete(&bitmap->shader->bitmaps,&local_28);
            bitmap->shader = (ALLEGRO_SHADER *)0x0;
          }
        }
        pAVar1 = pAVar4->default_shader;
        if (pAVar1 != (ALLEGRO_SHADER *)0x0) {
          (*pAVar1->vt->use_shader)(pAVar1,pAVar4,true);
          return true;
        }
        return true;
      }
      _Var2 = (*shader->vt->use_shader)(shader,pAVar4,true);
      if (!_Var2) {
        if (bitmap->shader != (ALLEGRO_SHADER *)0x0) {
          local_28 = bitmap;
          _al_vector_find_and_delete(&bitmap->shader->bitmaps,&local_28);
          bitmap->shader = (ALLEGRO_SHADER *)0x0;
        }
        _Var2 = _al_trace_prefix("shader",3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/shader.c"
                                 ,0xae,"al_use_shader");
        if (_Var2) {
          _al_trace_suffix("use_shader failed\n");
        }
        pAVar1 = pAVar4->default_shader;
        if (pAVar1 != (ALLEGRO_SHADER *)0x0) {
          (*pAVar1->vt->use_shader)(pAVar1,pAVar4,true);
        }
        return false;
      }
      _al_set_bitmap_shader_field(bitmap,shader);
      _Var2 = _al_trace_prefix("shader",0,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/shader.c"
                               ,0xa9,"al_use_shader");
      _Var5 = true;
      if (!_Var2) {
        return true;
      }
      msg = "use_shader succeeded\n";
      goto LAB_0015e401;
    }
    _Var2 = _al_trace_prefix("shader",2,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/shader.c"
                             ,0xa0,"al_use_shader");
    if (!_Var2) {
      return false;
    }
    msg = "Target bitmap is memory bitmap.\n";
  }
  _Var5 = false;
LAB_0015e401:
  _al_trace_suffix(msg);
  return _Var5;
}

Assistant:

bool al_use_shader(ALLEGRO_SHADER *shader)
{
   ALLEGRO_BITMAP *bmp = al_get_target_bitmap();
   ALLEGRO_DISPLAY *disp;

   if (!bmp) {
      ALLEGRO_WARN("No current target bitmap.\n");
      return false;
   }
   if (al_get_bitmap_flags(bmp) & ALLEGRO_MEMORY_BITMAP) {
      ALLEGRO_WARN("Target bitmap is memory bitmap.\n");
      return false;
   }
   disp = _al_get_bitmap_display(bmp);
   ASSERT(disp);

   if (shader) {
      if (shader->vt->use_shader(shader, disp, true)) {
         _al_set_bitmap_shader_field(bmp, shader);
         ALLEGRO_DEBUG("use_shader succeeded\n");
         return true;
      }
      else {
         _al_set_bitmap_shader_field(bmp, NULL);
         ALLEGRO_ERROR("use_shader failed\n");
         if (disp->default_shader) {
            disp->default_shader->vt->use_shader(
               disp->default_shader, disp, true);
         }
         return false;
      }
   }
   else {
      if (bmp->shader) {
         bmp->shader->vt->unuse_shader(bmp->shader, disp);
         _al_set_bitmap_shader_field(bmp, NULL);
      }
      if (disp->default_shader) {
         disp->default_shader->vt->use_shader(
            disp->default_shader, disp, true);
      }
      return true;
   }
}